

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::FunctionMockerBase<TestColumnSizeHandler_()>::DescribeDefaultActionTo
          (FunctionMockerBase<TestColumnSizeHandler_()> *this,ArgumentTuple *args,ostream *os)

{
  undefined8 *puVar1;
  char cVar2;
  ostream *poVar3;
  int in_ECX;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar4;
  string local_50;
  
  ppvVar4 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar4 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00177a0a;
    puVar1 = (undefined8 *)ppvVar4[-1];
    ppvVar4 = ppvVar4 + -1;
    local_50._M_string_length = 0;
    local_50._M_dataplus._M_p = (pointer)&PTR__MatchResultListener_002882b0;
    cVar2 = (**(code **)(*(long *)puVar1[4] + 0x20))((long *)puVar1[4],args,&local_50);
  } while (cVar2 == '\0');
  if (puVar1 == (undefined8 *)0x0) {
LAB_00177a0a:
    std::__ostream_insert<char,std::char_traits<char>>(os,"returning default value.\n",0x19);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"taking default action specified at:\n",0x24);
    FormatFileLocation_abi_cxx11_
              (&local_50,(internal *)*puVar1,(char *)(ulong)*(uint *)(puVar1 + 1),in_ECX);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DescribeDefaultActionTo(const ArgumentTuple& args,
                               ::std::ostream* os) const {
    const OnCallSpec<F>* const spec = FindOnCallSpec(args);

    if (spec == NULL) {
      *os << (internal::type_equals<Result, void>::value ?
              "returning directly.\n" :
              "returning default value.\n");
    } else {
      *os << "taking default action specified at:\n"
          << FormatFileLocation(spec->file(), spec->line()) << "\n";
    }
  }